

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

void Extra_TruthExist(uint *pTruth,int nVars,int iVar)

{
  int iVar1;
  int iVar2;
  int local_24;
  int Step;
  int k;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  uint *pTruth_local;
  
  iVar1 = Extra_TruthWordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0x1fb,"void Extra_TruthExist(unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = (pTruth[Step] & 0xaaaaaaaa) >> 1 | (pTruth[Step] & 0x55555555) << 1 |
                     pTruth[Step];
    }
    break;
  case 1:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = (pTruth[Step] & 0xcccccccc) >> 2 | (pTruth[Step] & 0x33333333) << 2 |
                     pTruth[Step];
    }
    break;
  case 2:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = (pTruth[Step] & 0xf0f0f0f0) >> 4 | (pTruth[Step] & 0xf0f0f0f) << 4 |
                     pTruth[Step];
    }
    break;
  case 3:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = (pTruth[Step] & 0xff00ff00) >> 8 | (pTruth[Step] & 0xff00ff) << 8 |
                     pTruth[Step];
    }
    break;
  case 4:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = pTruth[Step] >> 0x10 | pTruth[Step] << 0x10 | pTruth[Step];
    }
    break;
  default:
    iVar2 = 1 << ((char)iVar - 5U & 0x1f);
    _iVar_local = pTruth;
    for (local_24 = 0; local_24 < iVar1; local_24 = iVar2 * 2 + local_24) {
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        _iVar_local[Step] = _iVar_local[iVar2 + Step] | _iVar_local[Step];
        _iVar_local[iVar2 + Step] = _iVar_local[Step];
      }
      _iVar_local = _iVar_local + (iVar2 << 1);
    }
  }
  return;
}

Assistant:

void Extra_TruthExist( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xAAAAAAAA) >> 1) | ((pTruth[i] & 0x55555555) << 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xCCCCCCCC) >> 2) | ((pTruth[i] & 0x33333333) << 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xF0F0F0F0) >> 4) | ((pTruth[i] & 0x0F0F0F0F) << 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xFF00FF00) >> 8) | ((pTruth[i] & 0x00FF00FF) << 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xFFFF0000) >> 16) | ((pTruth[i] & 0x0000FFFF) << 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pTruth[i]     |= pTruth[Step+i];
                pTruth[Step+i] = pTruth[i];
            }
            pTruth += 2*Step;
        }
        return;
    }
}